

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_64bit_generated.h
# Opt level: O0

Offset<RootTable>
CreateRootTableDirect
          (FlatBufferBuilder64 *_fbb,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *far_vector,int32_t a,
          char *far_string,vector<unsigned_char,_std::allocator<unsigned_char>_> *big_vector,
          char *near_string,vector<unsigned_char,_std::allocator<unsigned_char>_> *nested_root,
          vector<LeafStruct,_std::allocator<LeafStruct>_> *far_struct_vector,
          vector<LeafStruct,_std::allocator<LeafStruct>_> *big_struct_vector,
          vector<flatbuffers::Offset<WrapperTable>,_std::allocator<flatbuffers::Offset<WrapperTable>_>_>
          *many_vectors,vector<unsigned_char,_std::allocator<unsigned_char>_> *forced_aligned_vector
          )

{
  Offset<RootTable> OVar1;
  size_type_conflict len;
  Offset<flatbuffers::Vector<flatbuffers::Offset<WrapperTable>,_unsigned_int>_> local_90;
  Offset<flatbuffers::String> local_8c;
  Offset<flatbuffers::Vector<flatbuffers::Offset<WrapperTable>,_unsigned_int>_> many_vectors__;
  Offset<flatbuffers::String> near_string__;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> forced_aligned_vector__;
  Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_long>_> big_struct_vector__;
  Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_int>_> far_struct_vector__;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> nested_root__;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> big_vector__;
  Offset64<flatbuffers::String> far_string__;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_int>_> far_vector__;
  char *near_string_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *big_vector_local;
  char *far_string_local;
  int32_t a_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *far_vector_local;
  FlatBufferBuilder64 *_fbb_local;
  
  if (far_vector == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    flatbuffers::Offset64<flatbuffers::Vector<unsigned_char,_unsigned_int>_>::Offset64
              ((Offset64<flatbuffers::Vector<unsigned_char,_unsigned_int>_> *)&far_string__,0);
  }
  else {
    far_string__.o =
         (offset_type_conflict)
         flatbuffers::FlatBufferBuilderImpl<true>::
         CreateVector64<flatbuffers::Vector,_unsigned_char>(_fbb,far_vector);
  }
  if (far_string == (char *)0x0) {
    flatbuffers::Offset64<flatbuffers::String>::Offset64
              ((Offset64<flatbuffers::String> *)&big_vector__,0);
  }
  else {
    big_vector__.o =
         (offset_type_conflict)
         flatbuffers::FlatBufferBuilderImpl<true>::CreateString<flatbuffers::Offset64>
                   (_fbb,far_string);
  }
  if (big_vector == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    flatbuffers::Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>::Offset64
              (&nested_root__,0);
  }
  else {
    nested_root__ =
         flatbuffers::FlatBufferBuilderImpl<true>::
         CreateVector64<flatbuffers::Vector64,_unsigned_char>(_fbb,big_vector);
  }
  if (nested_root == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    flatbuffers::Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>::Offset64
              ((Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> *)&far_struct_vector__,
               0);
  }
  else {
    far_struct_vector__.o =
         (offset_type_conflict)
         flatbuffers::FlatBufferBuilderImpl<true>::
         CreateVector64<flatbuffers::Vector64,_unsigned_char>(_fbb,nested_root);
  }
  if (far_struct_vector == (vector<LeafStruct,_std::allocator<LeafStruct>_> *)0x0) {
    flatbuffers::Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_int>_>::Offset64
              ((Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_int>_> *)
               &big_struct_vector__,0);
  }
  else {
    big_struct_vector__.o =
         (offset_type_conflict)
         flatbuffers::FlatBufferBuilderImpl<true>::
         CreateVectorOfStructs64<flatbuffers::Vector,_LeafStruct>(_fbb,far_struct_vector);
  }
  if (big_struct_vector == (vector<LeafStruct,_std::allocator<LeafStruct>_> *)0x0) {
    flatbuffers::Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_long>_>::Offset64
              ((Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_long>_> *)
               &forced_aligned_vector__,0);
  }
  else {
    forced_aligned_vector__.o =
         (offset_type_conflict)
         flatbuffers::FlatBufferBuilderImpl<true>::
         CreateVectorOfStructs64<flatbuffers::Vector64,_LeafStruct>(_fbb,big_struct_vector);
  }
  if (forced_aligned_vector == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    flatbuffers::Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>::Offset64
              ((Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> *)&many_vectors__,0);
  }
  else {
    len = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(forced_aligned_vector);
    flatbuffers::FlatBufferBuilderImpl<true>::ForceVectorAlignment64<true>(_fbb,len,1,0x20);
    _many_vectors__ =
         flatbuffers::FlatBufferBuilderImpl<true>::
         CreateVector64<flatbuffers::Vector64,_unsigned_char>(_fbb,forced_aligned_vector);
  }
  if (near_string == (char *)0x0) {
    flatbuffers::Offset<flatbuffers::String>::Offset(&local_8c,0);
  }
  else {
    local_8c = flatbuffers::FlatBufferBuilderImpl<true>::CreateString<flatbuffers::Offset>
                         (_fbb,near_string);
  }
  if (many_vectors ==
      (vector<flatbuffers::Offset<WrapperTable>,_std::allocator<flatbuffers::Offset<WrapperTable>_>_>
       *)0x0) {
    flatbuffers::Offset<flatbuffers::Vector<flatbuffers::Offset<WrapperTable>,_unsigned_int>_>::
    Offset(&local_90,0);
  }
  else {
    local_90 = flatbuffers::FlatBufferBuilderImpl<true>::
               CreateVector<flatbuffers::Offset<WrapperTable>,std::allocator<flatbuffers::Offset<WrapperTable>>>
                         (_fbb,many_vectors);
  }
  OVar1 = CreateRootTable(_fbb,(Offset64<flatbuffers::Vector<unsigned_char,_unsigned_int>_>)
                               far_string__.o,a,(Offset64<flatbuffers::String>)big_vector__.o,
                          nested_root__,local_8c,
                          (Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>)
                          far_struct_vector__.o,
                          (Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_int>_>)
                          big_struct_vector__.o,
                          (Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_long>_>)
                          forced_aligned_vector__.o,local_90,_many_vectors__);
  return (Offset<RootTable>)OVar1.o;
}

Assistant:

inline ::flatbuffers::Offset<RootTable> CreateRootTableDirect(
    ::flatbuffers::FlatBufferBuilder64 &_fbb,
    const std::vector<uint8_t> *far_vector = nullptr,
    int32_t a = 0,
    const char *far_string = nullptr,
    const std::vector<uint8_t> *big_vector = nullptr,
    const char *near_string = nullptr,
    const std::vector<uint8_t> *nested_root = nullptr,
    const std::vector<LeafStruct> *far_struct_vector = nullptr,
    const std::vector<LeafStruct> *big_struct_vector = nullptr,
    const std::vector<::flatbuffers::Offset<WrapperTable>> *many_vectors = nullptr,
    const std::vector<uint8_t> *forced_aligned_vector = nullptr) {
  auto far_vector__ = far_vector ? _fbb.CreateVector64<::flatbuffers::Vector>(*far_vector) : 0;
  auto far_string__ = far_string ? _fbb.CreateString<::flatbuffers::Offset64>(far_string) : 0;
  auto big_vector__ = big_vector ? _fbb.CreateVector64(*big_vector) : 0;
  auto nested_root__ = nested_root ? _fbb.CreateVector64(*nested_root) : 0;
  auto far_struct_vector__ = far_struct_vector ? _fbb.CreateVectorOfStructs64<::flatbuffers::Vector>(*far_struct_vector) : 0;
  auto big_struct_vector__ = big_struct_vector ? _fbb.CreateVectorOfStructs64(*big_struct_vector) : 0;
  if (forced_aligned_vector) { _fbb.ForceVectorAlignment64(forced_aligned_vector->size(), sizeof(uint8_t), 32); }
  auto forced_aligned_vector__ = forced_aligned_vector ? _fbb.CreateVector64(*forced_aligned_vector) : 0;
  auto near_string__ = near_string ? _fbb.CreateString(near_string) : 0;
  auto many_vectors__ = many_vectors ? _fbb.CreateVector<::flatbuffers::Offset<WrapperTable>>(*many_vectors) : 0;
  return CreateRootTable(
      _fbb,
      far_vector__,
      a,
      far_string__,
      big_vector__,
      near_string__,
      nested_root__,
      far_struct_vector__,
      big_struct_vector__,
      many_vectors__,
      forced_aligned_vector__);
}